

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_quadrature_mirror_filter_banks.cc
# Opt level: O2

bool __thiscall
sptk::PseudoQuadratureMirrorFilterBanks::Run
          (PseudoQuadratureMirrorFilterBanks *this,double input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  *this_00;
  bool bVar1;
  pointer ppBVar2;
  Buffer *pBVar3;
  iterator itr;
  long lVar4;
  pointer ppBVar5;
  bool bVar6;
  size_type __new_size;
  long lVar7;
  int k;
  long lVar8;
  
  bVar6 = false;
  if (((buffer != (Buffer *)0x0) &&
      (bVar6 = false, output != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (this->is_valid_ != false)) {
    __new_size = (size_type)this->num_subband_;
    if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
      __new_size = (size_type)this->num_subband_;
    }
    this_00 = &buffer->buffer_for_all_zero_filter_;
    ppBVar5 = (buffer->buffer_for_all_zero_filter_).
              super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppBVar2 = (buffer->buffer_for_all_zero_filter_).
              super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)ppBVar2 - (long)ppBVar5 >> 3 != __new_size) {
      for (; ppBVar5 != ppBVar2; ppBVar5 = ppBVar5 + 1) {
        if (*ppBVar5 != (Buffer *)0x0) {
          (*(*ppBVar5)->_vptr_Buffer[1])();
        }
        *ppBVar5 = (Buffer *)0x0;
        ppBVar2 = (buffer->buffer_for_all_zero_filter_).
                  super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      std::
      vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
      ::resize(this_00,(long)this->num_subband_);
      for (ppBVar5 = (this_00->
                     super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          ppBVar5 !=
          (buffer->buffer_for_all_zero_filter_).
          super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppBVar5 = ppBVar5 + 1) {
        pBVar3 = (Buffer *)operator_new(0x20);
        pBVar3->_vptr_Buffer = (_func_int **)&PTR__Buffer_00114bb0;
        (pBVar3->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar3->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar3->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *ppBVar5 = pBVar3;
      }
    }
    lVar7 = 0;
    lVar4 = 0;
    lVar8 = 0;
    do {
      bVar6 = this->num_subband_ <= lVar8;
      if (this->num_subband_ <= lVar8) {
        return bVar6;
      }
      bVar1 = AllZeroDigitalFilter::Run
                        (&this->all_zero_filter_,
                         (vector<double,_std::allocator<double>_> *)
                         ((long)&(((this->filter_banks_).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar4),input,
                         (double *)
                         ((long)(output->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar7),
                         *(Buffer **)
                          ((long)(this_00->
                                 super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar7));
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 0x18;
      lVar7 = lVar7 + 8;
    } while (bVar1);
  }
  return bVar6;
}

Assistant:

bool PseudoQuadratureMirrorFilterBanks::Run(
    double input, std::vector<double>* output,
    PseudoQuadratureMirrorFilterBanks::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || output == nullptr || buffer == nullptr) return false;

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(num_subband_)) {
    output->resize(num_subband_);
  }
  if (buffer->buffer_for_all_zero_filter_.size() !=
      static_cast<std::size_t>(num_subband_)) {
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      delete (*itr);
      *itr = NULL;
    }

    buffer->buffer_for_all_zero_filter_.resize(num_subband_);
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      *itr = new AllZeroDigitalFilter::Buffer();
    }
  }

  for (int k(0); k < num_subband_; ++k) {
    if (!all_zero_filter_.Run(filter_banks_[k], input, &((*output)[k]),
                              buffer->buffer_for_all_zero_filter_[k])) {
      return false;
    }
  }

  return true;
}